

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O3

void __thiscall
fmt::v11::detail::buffer<char>::append<char>(buffer<char> *this,char *begin,char *end)

{
  char *pcVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (begin != end) {
    sVar2 = this->size_;
    do {
      uVar5 = (long)end - (long)begin;
      uVar4 = this->capacity_;
      if (uVar4 < sVar2 + uVar5) {
        (*this->grow_)(this,sVar2 + uVar5);
        sVar2 = this->size_;
        uVar4 = this->capacity_;
      }
      uVar3 = uVar4 - sVar2;
      if (uVar5 <= uVar4 - sVar2) {
        uVar3 = uVar5;
      }
      if (uVar3 != 0) {
        pcVar1 = this->ptr_;
        uVar4 = 0;
        do {
          pcVar1[uVar4 + sVar2] = begin[uVar4];
          uVar4 = uVar4 + 1;
        } while (uVar3 != uVar4);
        sVar2 = this->size_;
      }
      sVar2 = sVar2 + uVar3;
      this->size_ = sVar2;
      begin = begin + uVar3;
    } while (begin != end);
  }
  return;
}

Assistant:

void
      append(const U* begin, const U* end) {
    while (begin != end) {
      auto count = to_unsigned(end - begin);
      try_reserve(size_ + count);
      auto free_cap = capacity_ - size_;
      if (free_cap < count) count = free_cap;
      // A loop is faster than memcpy on small sizes.
      T* out = ptr_ + size_;
      for (size_t i = 0; i < count; ++i) out[i] = begin[i];
      size_ += count;
      begin += count;
    }
  }